

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChooseGenerator.cpp
# Opt level: O1

int main(void)

{
  undefined4 in_stack_ffffffffffffff8c;
  SeedType in_stack_ffffffffffffff90;
  long *local_68;
  Result local_60;
  
  AxA_isGreaterThan_A::AxA_isGreaterThan_A((AxA_isGreaterThan_A *)&stack0xffffffffffffff90);
  cppqc::
  quickCheckOutput<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (&local_60,(cppqc *)&stack0xffffffffffffff90,
             (Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              *)&std::cout,(ostream *)0x64,0,0,CONCAT44(in_stack_ffffffffffffff8c,0xffffffff),
             (duration<double,_std::ratio<1L,_1L>_>)0x403e000000000000,in_stack_ffffffffffffff90);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60.labels._M_t);
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 8))();
  }
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(AxA_isGreaterThan_A());
}